

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gravity_core.c
# Opt level: O0

_Bool fiber_status(gravity_vm *vm,gravity_value_t *args,uint16_t nargs,uint32_t rindex)

{
  gravity_object_t *pgVar1;
  gravity_value_t value;
  gravity_value_t value_00;
  gravity_value_t value_01;
  gravity_fiber_t *fiber;
  uint32_t rindex_local;
  uint16_t nargs_local;
  gravity_value_t *args_local;
  gravity_vm *vm_local;
  
  pgVar1 = (args->field_1).p;
  if (pgVar1->htable == (gravity_hash_t *)0x0) {
    if (*(int *)&pgVar1->superclass == 0) {
      value_00.field_1.n = 2;
      value_00.isa = gravity_class_int;
      gravity_vm_setslot(vm,value_00,rindex);
    }
    else {
      value.field_1.n._0_4_ = *(undefined4 *)&pgVar1[1].gc.free;
      value.isa = gravity_class_int;
      value.field_1.n._4_4_ = 0;
      gravity_vm_setslot(vm,value,rindex);
    }
  }
  else {
    value_01.field_1.n = 1;
    value_01.isa = gravity_class_int;
    gravity_vm_setslot(vm,value_01,rindex);
  }
  return true;
}

Assistant:

static bool fiber_status (gravity_vm *vm, gravity_value_t *args, uint16_t nargs, uint32_t rindex) {
    #pragma unused(nargs)
    
    // status codes:
    // 0    never executed
    // 1    aborted with error
    // 2    terminated
    // 3    running
    // 4    trying
    
    gravity_fiber_t *fiber = VALUE_AS_FIBER(GET_VALUE(0));
    if (fiber->error) RETURN_VALUE(VALUE_FROM_INT(FIBER_ABORTED_WITH_ERROR), rindex);
    if (fiber->nframes == 0) RETURN_VALUE(VALUE_FROM_INT(FIBER_TERMINATED), rindex);
    RETURN_VALUE(VALUE_FROM_INT(fiber->status), rindex);
}